

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall
duckdb::RLEState<unsigned_short>::Update<duckdb::EmptyRLEWriter>
          (RLEState<unsigned_short> *this,unsigned_short *data,ValidityMask *validity,idx_t idx)

{
  unsigned_short uVar1;
  bool bVar2;
  rle_count_t rVar3;
  
  bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&validity->super_TemplatedValidityMask<unsigned_long>,idx);
  if (bVar2) {
    if (this->all_null == true) {
      this->last_value = data[idx];
      this->seen_count = this->seen_count + 1;
      rVar3 = this->last_seen_count + 1;
      this->last_seen_count = rVar3;
      this->all_null = false;
      goto LAB_01a366bb;
    }
    uVar1 = data[idx];
    rVar3 = this->last_seen_count;
    if (this->last_value != uVar1) {
      if (rVar3 != 0) {
        this->seen_count = this->seen_count + 1;
      }
      this->last_value = uVar1;
      this->last_seen_count = 1;
      return;
    }
  }
  else {
    rVar3 = this->last_seen_count;
  }
  rVar3 = rVar3 + 1;
  this->last_seen_count = rVar3;
LAB_01a366bb:
  if (rVar3 == 0xffff) {
    this->last_seen_count = 0;
    this->seen_count = this->seen_count + 1;
  }
  return;
}

Assistant:

void Update(const T *data, ValidityMask &validity, idx_t idx) {
		if (validity.RowIsValid(idx)) {
			if (all_null) {
				// no value seen yet
				// assign the current value, and increment the seen_count
				// note that we increment last_seen_count rather than setting it to 1
				// this is intentional: this is the first VALID value we see
				// but it might not be the first value in case of nulls!
				last_value = data[idx];
				seen_count++;
				last_seen_count++;
				all_null = false;
			} else if (last_value == data[idx]) {
				// the last value is identical to this value: increment the last_seen_count
				last_seen_count++;
			} else {
				// the values are different
				// issue the callback on the last value
				// edge case: if a value has exactly 2^16 repeated values, we can end up here with last_seen_count = 0
				if (last_seen_count > 0) {
					Flush<OP>();
					seen_count++;
				}

				// increment the seen_count and put the new value into the RLE slot
				last_value = data[idx];
				last_seen_count = 1;
			}
		} else {
			// NULL value: we merely increment the last_seen_count
			last_seen_count++;
		}
		if (last_seen_count == NumericLimits<rle_count_t>::Maximum()) {
			// we have seen the same value so many times in a row we are at the limit of what fits in our count
			// write away the value and move to the next value
			Flush<OP>();
			last_seen_count = 0;
			seen_count++;
		}
	}